

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPDecBuffer * WebPIDecodedArea(WebPIDecoder *idec,int *left,int *top,int *width,int *height)

{
  WebPDecBuffer *pWVar1;
  int *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  WebPIDecoder *in_RDI;
  int *in_R8;
  WebPDecBuffer *src;
  
  pWVar1 = GetOutputBuffer(in_RDI);
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (pWVar1 == (WebPDecBuffer *)0x0) {
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = 0;
    }
  }
  else {
    if (in_RCX != (int *)0x0) {
      *in_RCX = pWVar1->width;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = (in_RDI->params_).last_y;
    }
  }
  return pWVar1;
}

Assistant:

const WebPDecBuffer* WebPIDecodedArea(const WebPIDecoder* idec,
                                      int* left, int* top,
                                      int* width, int* height) {
  const WebPDecBuffer* const src = GetOutputBuffer(idec);
  if (left != NULL) *left = 0;
  if (top != NULL) *top = 0;
  if (src != NULL) {
    if (width != NULL) *width = src->width;
    if (height != NULL) *height = idec->params_.last_y;
  } else {
    if (width != NULL) *width = 0;
    if (height != NULL) *height = 0;
  }
  return src;
}